

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_FeatureTypes_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00721d10 == '\x01') {
    DAT_00721d10 = '\0';
    (*(code *)*_Int64FeatureType_default_instance_)();
  }
  if (DAT_00721d30 == '\x01') {
    DAT_00721d30 = '\0';
    (*(code *)*_DoubleFeatureType_default_instance_)();
  }
  if (DAT_00721d50 == '\x01') {
    DAT_00721d50 = '\0';
    (*(code *)*_StringFeatureType_default_instance_)();
  }
  if (DAT_00721d80 == '\x01') {
    DAT_00721d80 = '\0';
    (*(code *)*_SizeRange_default_instance_)();
  }
  if (DAT_00721db0 == '\x01') {
    DAT_00721db0 = '\0';
    (*(code *)*_ImageFeatureType_ImageSize_default_instance_)();
  }
  if (DAT_00721de8 == '\x01') {
    DAT_00721de8 = '\0';
    (*(code *)*_ImageFeatureType_EnumeratedImageSizes_default_instance_)();
  }
  if (DAT_00721e18 == '\x01') {
    DAT_00721e18 = '\0';
    (*(code *)*_ImageFeatureType_ImageSizeRange_default_instance_)();
  }
  if (DAT_00721e58 == '\x01') {
    DAT_00721e58 = '\0';
    (*(code *)*_ImageFeatureType_default_instance_)();
  }
  if (DAT_00721e98 == '\x01') {
    DAT_00721e98 = '\0';
    (*(code *)*_ArrayFeatureType_Shape_default_instance_)();
  }
  if (DAT_00721ed0 == '\x01') {
    DAT_00721ed0 = '\0';
    (*(code *)*_ArrayFeatureType_EnumeratedShapes_default_instance_)();
  }
  if (DAT_00721f08 == '\x01') {
    DAT_00721f08 = '\0';
    (*(code *)*_ArrayFeatureType_ShapeRange_default_instance_)();
  }
  if (DAT_00721f58 == '\x01') {
    DAT_00721f58 = '\0';
    (*(code *)*_ArrayFeatureType_default_instance_)();
  }
  if (DAT_00721fa0 == '\x01') {
    DAT_00721fa0 = '\0';
    (*(code *)*_DictionaryFeatureType_default_instance_)();
  }
  if (DAT_00721fe0 == '\x01') {
    DAT_00721fe0 = '\0';
    (*(code *)*_SequenceFeatureType_default_instance_)();
  }
  if (DAT_00722020 == '\x01') {
    DAT_00722020 = 0;
    (*(code *)*_FeatureType_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64FeatureType_default_instance_.Shutdown();
  _DoubleFeatureType_default_instance_.Shutdown();
  _StringFeatureType_default_instance_.Shutdown();
  _SizeRange_default_instance_.Shutdown();
  _ImageFeatureType_ImageSize_default_instance_.Shutdown();
  _ImageFeatureType_EnumeratedImageSizes_default_instance_.Shutdown();
  _ImageFeatureType_ImageSizeRange_default_instance_.Shutdown();
  _ImageFeatureType_default_instance_.Shutdown();
  _ArrayFeatureType_Shape_default_instance_.Shutdown();
  _ArrayFeatureType_EnumeratedShapes_default_instance_.Shutdown();
  _ArrayFeatureType_ShapeRange_default_instance_.Shutdown();
  _ArrayFeatureType_default_instance_.Shutdown();
  _DictionaryFeatureType_default_instance_.Shutdown();
  _SequenceFeatureType_default_instance_.Shutdown();
  _FeatureType_default_instance_.Shutdown();
}